

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_gfx_set_shader_value_v
               (rf_shader shader,int uniform_loc,void *value,int uniform_name,int count)

{
  int count_local;
  int uniform_name_local;
  void *value_local;
  int uniform_loc_local;
  
  (*(rf__ctx->field_0).gfx_ctx.gl.UseProgram)(shader.id);
  switch(uniform_name) {
  case 0:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1fv)(uniform_loc,count,(float *)value);
    break;
  case 1:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform2fv)(uniform_loc,count,(float *)value);
    break;
  case 2:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform3fv)(uniform_loc,count,(float *)value);
    break;
  case 3:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4fv)(uniform_loc,count,(float *)value);
    break;
  case 4:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1iv)(uniform_loc,count,(int *)value);
    break;
  case 5:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform2iv)(uniform_loc,count,(int *)value);
    break;
  case 6:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform3iv)(uniform_loc,count,(int *)value);
    break;
  case 7:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform4iv)(uniform_loc,count,(int *)value);
    break;
  case 8:
    (*(rf__ctx->field_0).gfx_ctx.gl.Uniform1iv)(uniform_loc,count,(int *)value);
    break;
  default:
    rf_log_impl(4,0x1b3b6f);
  }
  return;
}

Assistant:

RF_API void rf_gfx_set_shader_value_v(rf_shader shader, int uniform_loc, const void* value, int uniform_name, int count)
{
    rf_gl.UseProgram(shader.id);

    switch (uniform_name)
    {
        case RF_UNIFORM_FLOAT: rf_gl.Uniform1fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_VEC2: rf_gl.Uniform2fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_VEC3: rf_gl.Uniform3fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_VEC4: rf_gl.Uniform4fv(uniform_loc, count, (float* )value); break;
        case RF_UNIFORM_INT: rf_gl.Uniform1iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_IVEC2: rf_gl.Uniform2iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_IVEC3: rf_gl.Uniform3iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_IVEC4: rf_gl.Uniform4iv(uniform_loc, count, (int* )value); break;
        case RF_UNIFORM_SAMPLER2D: rf_gl.Uniform1iv(uniform_loc, count, (int* )value); break;
        default: RF_LOG(RF_LOG_TYPE_WARNING, "rf_shader uniform could not be set data type not recognized");
    }

    //rf_gl.UseProgram(0);      // Avoid reseting current shader program, in case other uniforms are set
}